

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.cpp
# Opt level: O0

void __thiscall QDebug::putUInt128(QDebug *this,void *p)

{
  long lVar1;
  undefined1 n [16];
  QTextStream *in_RSI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  quint128 i;
  Int128Buffer buffer;
  undefined1 uVar2;
  undefined7 uVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = 0xaa;
  uVar3 = 0xaaaaaaaaaaaaaa;
  n._8_8_ = in_RSI->_vptr_QTextStream;
  n._0_8_ = in_RDI;
  anon_unknown.dwarf_1d6ecc::i128ToStringHelper((Int128Buffer *)&DAT_aaaaaaaaaaaaaaaa,(quint128)n);
  QTextStream::operator<<(in_RSI,(char *)CONCAT71(uVar3,uVar2));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDebug::putUInt128([[maybe_unused]] const void *p)
{
#ifdef QT_SUPPORTS_INT128
    Q_ASSERT(p);
    quint128 i;
    memcpy(&i, p, sizeof(i)); // alignment paranoia
    Int128Buffer buffer;
    stream->ts << i128ToStringHelper(buffer, i);
    return;
#endif // QT_SUPPORTS_INT128
    stream->ts << int128Warning();
}